

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesFabricPortGetThroughput
          (zes_fabric_port_handle_t hPort,zes_fabric_port_throughput_t *pThroughput)

{
  zes_pfnFabricPortGetThroughput_t pfnGetThroughput;
  dditable_t *dditable;
  ze_result_t result;
  zes_fabric_port_throughput_t *pThroughput_local;
  zes_fabric_port_handle_t hPort_local;
  
  if (*(code **)(*(long *)(hPort + 8) + 0xc00) == (code *)0x0) {
    hPort_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPort_local._4_4_ =
         (**(code **)(*(long *)(hPort + 8) + 0xc00))(*(undefined8 *)hPort,pThroughput);
  }
  return hPort_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFabricPortGetThroughput(
        zes_fabric_port_handle_t hPort,                 ///< [in] Handle for the component.
        zes_fabric_port_throughput_t* pThroughput       ///< [in,out] Will contain the Fabric port throughput counters.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_fabric_port_object_t*>( hPort )->dditable;
        auto pfnGetThroughput = dditable->zes.FabricPort.pfnGetThroughput;
        if( nullptr == pfnGetThroughput )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPort = reinterpret_cast<zes_fabric_port_object_t*>( hPort )->handle;

        // forward to device-driver
        result = pfnGetThroughput( hPort, pThroughput );

        return result;
    }